

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoise.c
# Opt level: O2

float rnnoise_process_frame(DenoiseState *st,float *out,float *in)

{
  float (*pafVar1) [22];
  int iVar2;
  float *pfVar3;
  float (*pafVar4) [22];
  int i;
  long lVar5;
  ulong uVar6;
  float (*pafVar7) [22];
  ulong uVar8;
  int k;
  long lVar9;
  long lVar10;
  opus_val16 oVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  kiss_fft_cpx kVar15;
  float mindist;
  float fVar16;
  float fVar17;
  float dist;
  double dVar18;
  float vad_prob;
  double local_8a08;
  float local_8a00;
  float local_89fc;
  float local_89f8;
  int pitch_index;
  float *pre [1];
  undefined8 local_89e8 [11];
  float afStack_8990 [12];
  undefined8 local_8960;
  float local_8948;
  float local_8944;
  float g [22];
  float Exp [22];
  float Ex [22];
  float Ep [22];
  float local_87b8 [24];
  float x [480];
  float pitch_buf [864];
  float gf [481];
  kiss_fft_cpx X [481];
  kiss_fft_cpx x_1 [960];
  float p [960];
  kiss_fft_cpx P [960];
  
  memset(gf,0,0x784);
  gf[0] = 1.0;
  vad_prob = 0.0;
  fVar13 = st->mem_hp_x[0];
  fVar17 = st->mem_hp_x[1];
  for (lVar5 = 0; lVar5 != 0x1e0; lVar5 = lVar5 + 1) {
    fVar12 = in[lVar5];
    fVar16 = fVar13 + fVar12;
    fVar13 = (fVar16 * 1.99599 - (fVar12 + fVar12)) + fVar17;
    fVar17 = fVar16 * -0.996 + fVar12;
    st->mem_hp_x[0] = fVar13;
    st->mem_hp_x[1] = fVar17;
    x[lVar5] = fVar16;
  }
  memcpy(x_1,st,0x780);
  for (lVar5 = 0; lVar5 != 0x1e0; lVar5 = lVar5 + 1) {
    p[lVar5 + -0x5a0] = x[lVar5];
  }
  memcpy(st,x,0x780);
  apply_window(&x_1[0].r);
  forward_transform(X,&x_1[0].r);
  compute_band_energy(Ex,X);
  pfVar3 = st->pitch_buf;
  memmove(pfVar3,st->pitch_buf + 0x1e0,0x1380);
  memcpy(st->pitch_buf + 0x4e0,x,0x780);
  pre[0] = pfVar3;
  pitch_downsample(pre,pitch_buf,0x6c0,1);
  pitch_search(pitch_buf + 0x180,pitch_buf,0x3c0,0x24c,&pitch_index);
  pitch_index = 0x300 - pitch_index;
  oVar11 = remove_doubling(pitch_buf,0x300,0x3c,0x3c0,&pitch_index,st->last_period,st->last_gain);
  st->last_period = pitch_index;
  st->last_gain = oVar11;
  for (lVar5 = 0; lVar5 != 0x3c0; lVar5 = lVar5 + 1) {
    p[lVar5] = pfVar3[(0x300 - pitch_index) + (int)lVar5];
  }
  apply_window(p);
  forward_transform(P,p);
  compute_band_energy(Ep,P);
  compute_band_corr(Exp,X,P);
  for (lVar5 = 0; lVar5 != 0x16; lVar5 = lVar5 + 1) {
    dVar14 = (double)(Ex[lVar5] * Ep[lVar5]) + 0.001;
    if (dVar14 < 0.0) {
      local_8a08 = (double)Exp[lVar5];
      dVar14 = sqrt(dVar14);
      dVar18 = local_8a08;
    }
    else {
      dVar14 = SQRT(dVar14);
      dVar18 = (double)Exp[lVar5];
    }
    Exp[lVar5] = (float)(dVar18 / dVar14);
  }
  dct(local_87b8,Exp);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    *(float *)((long)&local_8960 + lVar5 * 4) = local_87b8[lVar5];
  }
  local_8960 = CONCAT44((float)((ulong)local_8960 >> 0x20) + -0.9,(float)local_8960 + -1.3);
  local_8948 = (float)(pitch_index + -300) * 0.01;
  fVar13 = -2.0;
  fVar12 = 0.0;
  fVar17 = fVar13;
  for (lVar5 = 0; lVar5 != 0x16; lVar5 = lVar5 + 1) {
    local_8a08 = (double)CONCAT44(local_8a08._4_4_,fVar12);
    local_89fc = Ex[lVar5];
    local_8a00 = fVar13;
    local_89f8 = fVar17;
    dVar14 = log10((double)local_89fc + 0.01);
    fVar13 = local_8a00 + -1.5;
    fVar17 = fVar13;
    if (fVar13 <= (float)dVar14) {
      fVar17 = (float)dVar14;
    }
    fVar12 = local_89f8 + -7.0;
    if (local_89f8 + -7.0 <= fVar17) {
      fVar12 = fVar17;
    }
    g[lVar5] = fVar12;
    if (fVar13 <= fVar12) {
      fVar13 = fVar12;
    }
    fVar17 = local_89f8;
    if (local_89f8 <= fVar12) {
      fVar17 = fVar12;
    }
    fVar12 = local_8a08._0_4_ + local_89fc;
  }
  if (0.04 <= fVar12) {
    dct((float *)local_89e8,g);
    local_89e8[0] =
         CONCAT44((float)((ulong)local_89e8[0] >> 0x20) + -4.0,(float)local_89e8[0] + -12.0);
    pafVar1 = st->cepstral_mem;
    iVar2 = st->memid;
    lVar5 = (long)iVar2;
    uVar6 = (ulong)(iVar2 - 1);
    if (lVar5 < 1) {
      uVar6 = lVar5 + 7;
    }
    for (lVar10 = 0; lVar10 != 0x16; lVar10 = lVar10 + 1) {
      st->cepstral_mem[lVar5][lVar10] = afStack_8990[lVar10 + -0x16];
    }
    uVar8 = (ulong)(iVar2 - 2);
    if (iVar2 < 2) {
      uVar8 = lVar5 + 6;
    }
    st->memid = iVar2 + 1;
    for (lVar10 = 0; lVar10 != 0x18; lVar10 = lVar10 + 4) {
      fVar13 = *(float *)((long)st->cepstral_mem[lVar5] + lVar10);
      fVar17 = *(float *)((long)pafVar1[uVar6] + lVar10);
      fVar12 = *(float *)((long)pafVar1[uVar8] + lVar10);
      *(float *)((long)local_89e8 + lVar10) = fVar13 + fVar17 + fVar12;
      *(float *)((long)afStack_8990 + lVar10) = fVar13 - fVar12;
      *(float *)((long)afStack_8990 + lVar10 + 0x18) = (fVar13 - (fVar17 + fVar17)) + fVar12;
    }
    if (iVar2 + 1 == 8) {
      st->memid = 0;
    }
    fVar13 = 0.0;
    pafVar4 = pafVar1;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      pafVar7 = pafVar1;
      fVar17 = 1e+15;
      for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
        fVar12 = 0.0;
        for (lVar9 = 0; lVar9 != 0x16; lVar9 = lVar9 + 1) {
          fVar16 = (*pafVar4)[lVar9] - (*pafVar7)[lVar9];
          fVar12 = fVar12 + fVar16 * fVar16;
        }
        if ((lVar10 != lVar5) && (fVar12 <= fVar17)) {
          fVar17 = fVar12;
        }
        pafVar7 = pafVar7 + 1;
      }
      fVar13 = fVar13 + fVar17;
      pafVar4 = pafVar4 + 1;
    }
    local_8944 = fVar13 * 0.125 + -2.1;
    compute_rnn(&st->rnn,g,&vad_prob,(float *)local_89e8);
    pitch_filter(X,P,Ex,Ep,Exp,g);
    for (lVar5 = 0; lVar5 != 0x16; lVar5 = lVar5 + 1) {
      fVar17 = st->lastg[lVar5] * 0.6;
      fVar13 = g[lVar5];
      if (g[lVar5] <= fVar17) {
        fVar13 = fVar17;
      }
      g[lVar5] = fVar13;
      st->lastg[lVar5] = fVar13;
    }
    interp_band_gain(gf,g);
    for (lVar5 = 0; lVar5 != 0x1e1; lVar5 = lVar5 + 1) {
      kVar15.r = gf[lVar5] * X[lVar5].r;
      kVar15.i = gf[lVar5] * X[lVar5].i;
      X[lVar5] = kVar15;
    }
  }
  else {
    memset(local_89e8,0,0xa8);
  }
  check_init();
  for (lVar5 = 0; lVar5 != 0x1e1; lVar5 = lVar5 + 1) {
    x_1[lVar5] = X[lVar5];
  }
  pfVar3 = &x_1[0x1e1].i;
  for (lVar5 = 0xef8; lVar5 != 0; lVar5 = lVar5 + -8) {
    ((kiss_fft_cpx *)(pfVar3 + -1))->r = *(float *)((long)&x_1[0].r + lVar5);
    *pfVar3 = -*(float *)((long)&x_1[0].i + lVar5);
    pfVar3 = pfVar3 + 2;
  }
  opus_fft_c(common.kfft,x_1,(kiss_fft_cpx *)p);
  pfVar3 = pitch_buf;
  pitch_buf[0] = p[0] * 960.0;
  for (lVar5 = 0x1df8; pfVar3 = pfVar3 + 1, lVar5 != 0; lVar5 = lVar5 + -8) {
    *pfVar3 = *(float *)((long)p + lVar5) * 960.0;
  }
  apply_window(pitch_buf);
  for (lVar5 = 0; lVar5 != 0x1e0; lVar5 = lVar5 + 1) {
    out[lVar5] = pitch_buf[lVar5] + st->synthesis_mem[lVar5];
  }
  memcpy(st->synthesis_mem,pitch_buf + 0x1e0,0x780);
  return vad_prob;
}

Assistant:

float rnnoise_process_frame(DenoiseState *st, float *out, const float *in) {
    int i;
    kiss_fft_cpx X[FREQ_SIZE];
    kiss_fft_cpx P[WINDOW_SIZE];
    float x[FRAME_SIZE];
    float Ex[NB_BANDS], Ep[NB_BANDS];
    float Exp[NB_BANDS];
    float features[NB_FEATURES];
    float g[NB_BANDS];
    float gf[FREQ_SIZE] = {1};
    float vad_prob = 0;
    int silence;
    static const float a_hp[2] = {-1.99599, 0.99600};
    static const float b_hp[2] = {-2, 1};
    biquad(x, st->mem_hp_x, in, b_hp, a_hp, FRAME_SIZE); // high pass 高通滤波 抑制50Hz或60Hz的电源干扰
    silence = compute_frame_features(st, X, P, Ex, Ep, Exp, features, x);

    if (!silence) { // 非静音帧
        compute_rnn(&st->rnn, g, &vad_prob, features);
        pitch_filter(X, P, Ex, Ep, Exp, g);
        for (i = 0; i < NB_BANDS; i++) {
            float alpha = .6f;
            g[i] = MAX16(g[i], alpha * st->lastg[i]);
            st->lastg[i] = g[i];
        }
        interp_band_gain(gf, g);
#if 1
        for (i = 0; i < FREQ_SIZE; i++) {
            X[i].r *= gf[i];
            X[i].i *= gf[i];
        }
#endif
    }
    frame_synthesis(st, out, X);
    return vad_prob;
}